

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask9_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] << 9 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 0x12 | uVar1;
  *out = uVar1;
  uVar2 = in[3];
  *out = uVar2 << 0x1b | uVar1;
  uVar2 = uVar2 >> 5;
  out[1] = uVar2;
  uVar2 = in[4] << 4 | uVar2;
  out[1] = uVar2;
  uVar2 = in[5] << 0xd | uVar2;
  out[1] = uVar2;
  uVar2 = in[6] << 0x16 | uVar2;
  out[1] = uVar2;
  uVar1 = in[7];
  out[1] = uVar1 << 0x1f | uVar2;
  out[2] = uVar1 >> 1;
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask9_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (9 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (9 - 8);
  ++in;

  return out + 1;
}